

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O3

void __thiscall tl::StrT<char32_t>::construct(StrT<char32_t> *this,CStrT<char32_t> o)

{
  uint uVar1;
  char32_t *__dest;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = o._size;
  this->_size = uVar2;
  uVar1 = (uint)(o._0_8_ >> 1) & 0x7fffffff | uVar2;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = (uVar1 >> 0x10 | uVar1) + 1;
  uVar3 = 0x20;
  if (0x20 < uVar1) {
    uVar3 = (ulong)uVar1;
  }
  __dest = (char32_t *)operator_new__(uVar3 << 2);
  this->_str = __dest;
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = o._0_8_ & 0xffffffff;
    memcpy(__dest,o._str,uVar3 * 4);
  }
  __dest[uVar3] = L'\0';
  return;
}

Assistant:

void StrT<CharT>::construct(CStrT<CharT> o)
{
    _size = o.size();
    const u32 capacity = calcCapacity(_size);
    _str = new CharT[capacity];
    for(u32 i=0; i<_size; i++) {
        _str[i] = o[i];
    }
    _str[_size] = 0;
}